

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regalloc.cpp
# Opt level: O0

Error __thiscall asmjit::RAPass::removeUnreachableCode(RAPass *this)

{
  CBNode *pCVar1;
  CBNode *pCVar2;
  long in_RDI;
  bool remove;
  CBNode *next;
  bool removeEverything;
  CBNode *end;
  CBNode *first;
  CBNode *node;
  CBNode *stop;
  Link *link;
  bool local_a9;
  CBNode *pCVar3;
  undefined7 in_stack_ffffffffffffff60;
  byte bVar4;
  CBNode *local_88;
  undefined8 *local_78;
  
  local_78 = *(undefined8 **)(in_RDI + 0x98);
  pCVar1 = *(CBNode **)(in_RDI + 0x88);
  do {
    if (local_78 == (undefined8 *)0x0) {
      return 0;
    }
    pCVar3 = (CBNode *)local_78[1];
    if (((pCVar3 != (CBNode *)0x0) && (pCVar3->_prev != (CBNode *)0x0)) &&
       (local_88 = pCVar3, pCVar3 != pCVar1)) {
      do {
        if (local_88->_passData != (void *)0x0) break;
        local_88 = local_88->_next;
      } while (local_88 != pCVar1);
      pCVar2 = local_88;
      if (local_88 != pCVar3) {
        bVar4 = 1;
        local_88 = pCVar3;
        do {
          pCVar3 = local_88->_next;
          local_a9 = (local_88->_flags & 4) != 0;
          if (!local_a9) {
            if (local_88->_type == '\x04') {
              bVar4 = 0;
            }
            local_a9 = (bool)(bVar4 & 1);
          }
          if (local_a9 != false) {
            CodeBuilder::removeNode((CodeBuilder *)CONCAT17(bVar4,in_stack_ffffffffffffff60),pCVar3)
            ;
          }
          local_88 = pCVar3;
        } while (pCVar3 != pCVar2);
      }
    }
    local_78 = (undefined8 *)*local_78;
  } while( true );
}

Assistant:

Error RAPass::removeUnreachableCode() {
  ZoneList<CBNode*>::Link* link = _unreachableList.getFirst();
  CBNode* stop = getStop();

  while (link) {
    CBNode* node = link->getValue();
    if (node && node->getPrev() && node != stop) {
      // Locate all unreachable nodes.
      CBNode* first = node;
      do {
        if (node->hasPassData()) break;
        node = node->getNext();
      } while (node != stop);

      // Remove unreachable nodes that are neither informative nor directives.
      if (node != first) {
        CBNode* end = node;
        node = first;

        // NOTE: The strategy is as follows:
        // 1. The algorithm removes everything until it finds a first label.
        // 2. After the first label is found it removes only removable nodes.
        bool removeEverything = true;
        do {
          CBNode* next = node->getNext();
          bool remove = node->isRemovable();

          if (!remove) {
            if (node->isLabel())
              removeEverything = false;
            remove = removeEverything;
          }

          if (remove)
            cc()->removeNode(node);

          node = next;
        } while (node != end);
      }
    }

    link = link->getNext();
  }

  return kErrorOk;
}